

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.h
# Opt level: O3

void __thiscall Tle::Tle(Tle *this,Tle *tle)

{
  double dVar1;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->line_one_)._M_dataplus._M_p = (pointer)&(this->line_one_).field_2;
  (this->line_one_)._M_string_length = 0;
  (this->line_one_).field_2._M_local_buf[0] = '\0';
  (this->line_two_)._M_dataplus._M_p = (pointer)&(this->line_two_).field_2;
  (this->line_two_)._M_string_length = 0;
  (this->line_two_).field_2._M_local_buf[0] = '\0';
  (this->int_designator_)._M_dataplus._M_p = (pointer)&(this->int_designator_).field_2;
  (this->int_designator_)._M_string_length = 0;
  (this->int_designator_).field_2._M_local_buf[0] = '\0';
  DateTime::Initialise(&this->epoch_,1,1,1,0,0,0,0);
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->line_one_);
  std::__cxx11::string::_M_assign((string *)&this->line_two_);
  this->norad_number_ = tle->norad_number_;
  std::__cxx11::string::_M_assign((string *)&this->int_designator_);
  (this->epoch_).m_encoded = (tle->epoch_).m_encoded;
  dVar1 = tle->mean_motion_ddt6_;
  this->mean_motion_dt2_ = tle->mean_motion_dt2_;
  this->mean_motion_ddt6_ = dVar1;
  dVar1 = tle->inclination_;
  this->bstar_ = tle->bstar_;
  this->inclination_ = dVar1;
  dVar1 = tle->eccentricity_;
  this->right_ascending_node_ = tle->right_ascending_node_;
  this->eccentricity_ = dVar1;
  dVar1 = tle->mean_anomaly_;
  this->argument_perigee_ = tle->argument_perigee_;
  this->mean_anomaly_ = dVar1;
  this->mean_motion_ = tle->mean_motion_;
  this->orbit_number_ = tle->orbit_number_;
  return;
}

Assistant:

Tle(const Tle& tle)
    {
        name_ = tle.name_;
        line_one_ = tle.line_one_;
        line_two_ = tle.line_two_;

        norad_number_ = tle.norad_number_;
        int_designator_ = tle.int_designator_;
        epoch_ = tle.epoch_;
        mean_motion_dt2_ = tle.mean_motion_dt2_;
        mean_motion_ddt6_ = tle.mean_motion_ddt6_;
        bstar_ = tle.bstar_;
        inclination_ = tle.inclination_;
        right_ascending_node_ = tle.right_ascending_node_;
        eccentricity_ = tle.eccentricity_;
        argument_perigee_ = tle.argument_perigee_;
        mean_anomaly_ = tle.mean_anomaly_;
        mean_motion_ = tle.mean_motion_;
        orbit_number_ = tle.orbit_number_;
    }